

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

void TTD::NSSnapObjects::AssertSnapEquiv_SnapScriptFunctionInfo
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  TTString *str1;
  TTString *str2;
  bool condition;
  
  if ((sobj1->SnapObjectTag == SnapScriptFunctionObject) &&
     (sobj2->SnapObjectTag == SnapScriptFunctionObject)) {
    str1 = (TTString *)sobj1->AddtlSnapObjectInfo;
    str2 = (TTString *)sobj2->AddtlSnapObjectInfo;
    condition = TTStringEQForDiagnostics(str1,str2);
    TTDCompareMap::DiagnosticAssert(compareMap,condition);
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_FunctionBody
              (compareMap,*(TTD_PTR_ID *)(str1 + 1),*(TTD_PTR_ID *)(str2 + 1));
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Special
              (compareMap,(TTD_PTR_ID)str1[1].Contents,(TTD_PTR_ID)str2[1].Contents,L"scopes");
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Special
              (compareMap,*(TTD_PTR_ID *)(str1 + 2),*(TTD_PTR_ID *)(str2 + 2),L"cachedScopeObj");
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Special
              (compareMap,(TTD_PTR_ID)str1[2].Contents,(TTD_PTR_ID)str2[2].Contents,L"homeObject");
    NSSnapValues::AssertSnapEquivTTDVar_Special
              (*(TTDVar *)(str1 + 3),*(TTDVar *)(str2 + 3),compareMap,L"computedName");
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void AssertSnapEquiv_SnapScriptFunctionInfo(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            const SnapScriptFunctionInfo* snapFuncInfo1 = SnapObjectGetAddtlInfoAs<SnapScriptFunctionInfo*, SnapObjectType::SnapScriptFunctionObject>(sobj1);
            const SnapScriptFunctionInfo* snapFuncInfo2 = SnapObjectGetAddtlInfoAs<SnapScriptFunctionInfo*, SnapObjectType::SnapScriptFunctionObject>(sobj2);

            compareMap.DiagnosticAssert(TTStringEQForDiagnostics(snapFuncInfo1->DebugFunctionName, snapFuncInfo2->DebugFunctionName));

            compareMap.CheckConsistentAndAddPtrIdMapping_FunctionBody(snapFuncInfo1->BodyRefId, snapFuncInfo2->BodyRefId);
            compareMap.CheckConsistentAndAddPtrIdMapping_Special(snapFuncInfo1->ScopeId, snapFuncInfo2->ScopeId, _u("scopes"));

            compareMap.CheckConsistentAndAddPtrIdMapping_Special(snapFuncInfo1->CachedScopeObjId, snapFuncInfo2->CachedScopeObjId, _u("cachedScopeObj"));
            compareMap.CheckConsistentAndAddPtrIdMapping_Special(snapFuncInfo1->HomeObjId, snapFuncInfo2->HomeObjId, _u("homeObject"));

            NSSnapValues::AssertSnapEquivTTDVar_Special(snapFuncInfo1->ComputedNameInfo, snapFuncInfo2->ComputedNameInfo, compareMap, _u("computedName"));
        }